

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

double ON_Material::FresnelReflectionCoefficient
                 (double fresnel_index_of_refraction,double *N,double *R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = *N;
  dVar6 = N[1];
  dVar7 = *R;
  dVar1 = R[1];
  dVar2 = N[2];
  dVar3 = R[2];
  dVar4 = ON_Length3d(dVar5 - dVar7,dVar6 - dVar1,dVar2 - dVar3);
  if (2.2250738585072014e-308 < dVar4) {
    dVar4 = ((dVar2 - dVar3) * N[2] + (dVar5 - dVar7) * *N + (dVar6 - dVar1) * N[1]) / dVar4;
    dVar6 = fresnel_index_of_refraction * fresnel_index_of_refraction + dVar4 * dVar4 + -1.0;
    dVar5 = 0.0;
    if (0.0 < dVar6) {
      if (dVar6 < 0.0) {
        dVar5 = sqrt(dVar6);
      }
      else {
        dVar5 = SQRT(dVar6);
      }
    }
    dVar6 = dVar4 + dVar5;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      dVar5 = (dVar5 - dVar4) / dVar6;
      if (ABS(dVar5) <= 1e-154) {
        return 0.0;
      }
      dVar7 = dVar4 * dVar6 + 1.0;
      if (((dVar7 != 0.0) || (NAN(dVar7))) &&
         (dVar7 = (dVar4 * dVar6 + -1.0) / dVar7,
         dVar5 = (dVar7 * dVar7 + 1.0) * dVar5 * 0.5 * dVar5, (long)ABS(dVar5) < 0x7ff0000000000000)
         ) {
        return dVar5;
      }
    }
  }
  return 1.0;
}

Assistant:

double ON_Material::FresnelReflectionCoefficient(
  double fresnel_index_of_refraction,
  const double N[3],
  const double R[3]
  )
{
  double x,y,z,c,g;

  for(;;)
  {
    x = N[0]-R[0];
    y = N[1]-R[1];
    z = N[2]-R[2];
    c = ON_Length3d(x,y,z);
    if ( !(c > ON_DBL_MIN) )
      break;

    c = (N[0]*x + N[1]*y + N[2]*z)/c; // c = N o (N - R) / |N - R|

    g = fresnel_index_of_refraction*fresnel_index_of_refraction + c*c - 1.0;
    g = (g > 0.0) ? sqrt(g) : 0.0;

    // unsafe (potential divide by zero, overflow, ...) and inefficient
    // return ( ((g-c)*(g-c))/(2*(g+c)*(g+c)) ) * (1.0f + ( ((c*(g+c)-1.0)*(c*(g+c)-1.0))/((c*(g+c)+1.0)*(c*(g+c)+1.0)) ) );

    x = g+c;
    if ( !(x != 0.0) )
      break; // x is NAN or zero

    z = (g-c)/x; // z = (g-c)/(g+c)
    if ( fabs(z) <= 1.0e-154 )
      return 0.0; // z*z below will be zero or denormalized

    x *= c; // x = c*(g+c)

    y = x + 1.0; // y = c*(g+c) + 1.0
    if ( !(y != 0.0) )
      break; // y is NAN or zero

    y = (x - 1.0)/y; // y = (c*(g+c) - 1.0)/(c*(g+c) + 1.0)

    x =  0.5*z*z*(1.0 + y*y);
    if ( !(x == x) )
      break; // x is NAN

    if ( !ON_IS_FINITE(x) )
      break; // x is infinity

    return x; // x is
  }

  return 1.0; // error occurred
}